

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.c
# Opt level: O1

int mixed_register_segment
              (char *name,uint32_t argc,mixed_segment_field_info *args,
              mixed_make_segment_function function)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  segment_entry *psVar4;
  segment_entry *__s1;
  mixed_make_segment_function *pp_Var5;
  ulong uVar6;
  bool bVar7;
  
  if (argc < 0x21) {
    sVar3 = strlen(name);
    if ((uint)sVar3 < 0x41) {
      if (segments.count < 0x400) {
        bVar7 = segments.count != 0;
        if (segments.count == 0) {
          __s1 = (segment_entry *)0x0;
        }
        else {
          pp_Var5 = &segments.entries[0].function;
          uVar6 = 0;
          psVar4 = (segment_entry *)0x0;
          do {
            __s1 = (segment_entry *)(pp_Var5 + -9);
            if ((psVar4 == (segment_entry *)0x0) && (*pp_Var5 == (mixed_make_segment_function)0x0))
            {
              bVar1 = true;
            }
            else {
              iVar2 = strcmp((char *)__s1,name);
              bVar1 = true;
              __s1 = psVar4;
              if (iVar2 == 0) {
                mixed_err(0x17);
                bVar1 = false;
              }
            }
            if (!bVar1) break;
            uVar6 = uVar6 + 1;
            pp_Var5 = pp_Var5 + 0x8a;
            bVar7 = uVar6 < segments.count;
            psVar4 = __s1;
          } while (bVar7);
        }
        if (bVar7) {
          return 0;
        }
        psVar4 = segments.entries + segments.count;
        if (__s1 != (segment_entry *)0x0) {
          psVar4 = __s1;
        }
        memcpy(psVar4,name,(ulong)((uint)sVar3 & 0x7f));
        psVar4->argc = argc;
        memcpy(psVar4->args,args,(ulong)(argc << 5));
        psVar4->function = function;
        segments.count = segments.count + 1;
        return 1;
      }
      iVar2 = 1;
    }
    else {
      iVar2 = 0x1a;
    }
  }
  else {
    iVar2 = 0x19;
  }
  mixed_err(iVar2);
  return 0;
}

Assistant:

MIXED_EXPORT int mixed_register_segment(const char *name, uint32_t argc, struct mixed_segment_field_info *args, mixed_make_segment_function function){
  struct segment_entry *entry = 0;

  if(MIXED_MAX_MAKE_ARG_COUNT < argc){
    mixed_err(MIXED_BAD_ARGUMENT_COUNT);
    return 0;
  }

  uint32_t name_length = strlen(name);
  if(MIXED_MAX_SEGMENT_NAME_LENGTH < name_length){
    mixed_err(MIXED_BAD_NAME);
    return 0;
  }

  if(MIXED_MAX_SEGMENT_COUNT <= segments.count){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  for(uint32_t i=0; i<segments.count; ++i){
    struct segment_entry *cur_entry = &segments.entries[i];
    if(!entry && !cur_entry->function){
      entry = cur_entry;
    }else if(strcmp(cur_entry->name, name) == 0){
      mixed_err(MIXED_DUPLICATE_SEGMENT);
      return 0;
    }
  }

  if(!entry){
    entry = &segments.entries[segments.count];
  }

  memcpy(entry->name, name, name_length);
  entry->argc = argc;
  memcpy(entry->args, args, argc*sizeof(struct mixed_segment_field_info));
  entry->function = function;
  segments.count++;

  return 1;
}